

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::Join(Worker *this)

{
  bool bVar1;
  element_type *peVar2;
  lock_guard<std::mutex> local_28;
  lock_t lock;
  shared_ptr<restincurl::Worker::WorkerThread> thd;
  Worker *this_local;
  
  std::shared_ptr<restincurl::Worker::WorkerThread>::shared_ptr
            ((shared_ptr<restincurl::Worker::WorkerThread> *)&lock);
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mutex_);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->thread_);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->thread_);
    bVar1 = WorkerThread::Joinable(peVar2);
    if (bVar1) {
      std::shared_ptr<restincurl::Worker::WorkerThread>::operator=
                ((shared_ptr<restincurl::Worker::WorkerThread> *)&lock,&this->thread_);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&lock);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&lock);
    WorkerThread::Join(peVar2);
  }
  std::shared_ptr<restincurl::Worker::WorkerThread>::~shared_ptr
            ((shared_ptr<restincurl::Worker::WorkerThread> *)&lock);
  return;
}

Assistant:

void Join() const {
            decltype(thread_) thd;

            {
                lock_t lock(mutex_);
                if (thread_ && thread_->Joinable()) {
                    thd = thread_;
                }
            }

            if (thd) {
                thd->Join();
            }
        }